

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::KcpTcpEventLoop::handleUdpRead(KcpTcpEventLoop *this,Timestamp param_1)

{
  sz_sock fd;
  size_t sVar1;
  bool bVar2;
  sockaddr *addr;
  sz_ssize_t sVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  SourceFile file;
  SourceFile file_00;
  Logger local_1028;
  undefined1 local_58 [12];
  undefined1 local_48 [12];
  int local_34 [2];
  int savedErrno;
  
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  local_34[0] = 0;
  do {
    fd = (this->m_udpSocket).m_sockfd;
    addr = sockets::sz_sockaddr_cast(&this->m_curRecvAddr);
    sVar3 = Buffer::recvFrom(&this->m_inputBuffer,fd,addr,local_34);
    if (sVar3 != -1) break;
  } while (local_34[0] == 4);
  if (sVar3 < 0) {
    bVar2 = sockets::sz_wouldblock();
    if (!bVar2) {
      Logger::SourceFile::SourceFile<106>
                ((SourceFile *)local_58,
                 (char (*) [106])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_58._0_8_;
      file_00.m_size = local_58._8_4_;
      Logger::Logger(&local_1028,file_00,0x7e,false);
      LogStream::operator<<(&local_1028.m_impl.m_stream,"KcpTcpEventLoop::handleUdpRead");
      goto LAB_0013dc15;
    }
  }
  else {
    (this->m_netStatInfo).m_recvBytes = (this->m_netStatInfo).m_recvBytes + sVar3;
  }
  if ((this->m_inputBuffer).m_writerIndex != (this->m_inputBuffer).m_readerIndex) {
    iVar4 = std::
            _Hashtable<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_addrConns)._M_h,&this->m_curRecvAddr);
    if ((iVar4.
         super__Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
         ._M_cur == (__node_type *)0x0) ||
       ((this->m_inputBuffer).m_writerIndex - (this->m_inputBuffer).m_readerIndex < 0x18)) {
      handleNewUdpMessage(this);
    }
    else {
      this->m_curConv =
           *(uint32_t *)
            (*(long *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
                             ._M_cur + 0x18) + 0x40);
      iVar5 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
              ::find(&(this->m_kcpConnections)._M_t,&this->m_curConv);
      iVar6 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
              ::find(&(this->m_tcpConnections)._M_t,&this->m_curConv);
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("fKcpIter != m_kcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x93,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("fTcpIter != m_tcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x94,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if (iVar5._M_node[1]._M_color != iVar6._M_node[1]._M_color) {
        __assert_fail("fKcpIter->first == fTcpIter->first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x95,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if (*(int *)((long)&iVar6._M_node[1]._M_parent[1]._M_right + 4) != 2) {
        __assert_fail("fTcpIter->second->connected()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x96,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_curTcpConn).
                  super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &iVar6._M_node[1]._M_parent);
      std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_curKcpConn).
                  super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &iVar5._M_node[1]._M_parent);
      handleKcpMessage(this);
    }
    sVar1 = (this->m_inputBuffer).m_nCheapPrepend;
    (this->m_inputBuffer).m_readerIndex = sVar1;
    (this->m_inputBuffer).m_writerIndex = sVar1;
    return;
  }
  Logger::SourceFile::SourceFile<106>
            ((SourceFile *)local_48,
             (char (*) [106])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_48._0_8_;
  file.m_size = local_48._8_4_;
  Logger::Logger(&local_1028,file,0x85,ERROR);
  LogStream::operator<<(&local_1028.m_impl.m_stream,"m_inputBuffer.recvFrom return zero");
LAB_0013dc15:
  Logger::~Logger(&local_1028);
  return;
}

Assistant:

void KcpTcpEventLoop::handleUdpRead(Timestamp)
{
	assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	do
	{
		n = m_inputBuffer.recvFrom(m_udpSocket.fd(), sockets::sz_sockaddr_cast(&m_curRecvAddr), &savedErrno);
	} while (n == -1 && savedErrno == sz_err_eintr);
	if (n >= 0)
	{
		m_netStatInfo.m_recvBytes += n;
	}
	else
	{
		if (!sockets::sz_wouldblock())
		{
			LOG_SYSERR << "KcpTcpEventLoop::handleUdpRead";
			return;
		}
	}

	if (m_inputBuffer.readableBytes() == 0)
	{
		LOG_ERROR << "m_inputBuffer.recvFrom return zero";
		return;
	}
	// 需要考虑客户端与服务器异步原因造成，回执结果丢包 | 客户端收到前超时再次发送握手校验
	auto fAddrConnIter = m_addrConns.find(m_curRecvAddr);
	if (fAddrConnIter == m_addrConns.end() || m_inputBuffer.readableBytes() < KcpConnection::kKCP_OVERHEAD_SIZE)
	{
		handleNewUdpMessage();
		m_inputBuffer.retrieveAll();
		return;
	}
	m_curConv = fAddrConnIter->second->getConvId();
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(m_curConv);
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(m_curConv);
	assert(fKcpIter != m_kcpConnections.end());
	assert(fTcpIter != m_tcpConnections.end());
	assert(fKcpIter->first == fTcpIter->first);
	assert(fTcpIter->second->connected());
	m_curTcpConn = fTcpIter->second;
	m_curKcpConn = fKcpIter->second;
	handleKcpMessage();
	m_inputBuffer.retrieveAll();
}